

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::TestTexture1DArray::TestTexture1DArray
          (TestTexture1DArray *this,CompressedTexFormat *format,int width,int arraySize)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> layers;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> local_78;
  PixelBufferAccess local_58;
  
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)&PTR__TestTexture1DArray_00d21888;
  local_58.super_ConstPixelBufferAccess.m_format = tcu::getUncompressedFormat(*format);
  tcu::Texture1DArray::Texture1DArray(&this->m_texture,(TextureFormat *)&local_58,width,arraySize);
  allocateLevels<tcu::Texture1DArray>(&this->m_texture);
  local_78.super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (int)((ulong)((long)(this->m_texture).super_TextureLevelPyramid.m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_texture).super_TextureLevelPyramid.m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333) {
    uVar2 = 0;
    do {
      if (0 < (this->m_texture).m_numLayers) {
        uVar3 = 0;
        do {
          (*(this->super_TestTexture)._vptr_TestTexture[7])
                    (&local_58,this,(ulong)uVar2,(ulong)uVar3);
          std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::
          emplace_back<tcu::PixelBufferAccess>(&local_78,&local_58);
          uVar3 = uVar3 + 1;
        } while ((int)uVar3 < (this->m_texture).m_numLayers);
      }
      uVar2 = uVar2 + 1;
      iVar1 = (int)((ulong)((long)(this->m_texture).super_TextureLevelPyramid.m_access.
                                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_texture).super_TextureLevelPyramid.m_access.
                                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
    } while (SBORROW4(uVar2,iVar1 * -0x33333333) != (int)(uVar2 + iVar1 * 0x33333333) < 0);
  }
  TestTexture::populateCompressedLevels(&this->super_TestTexture,*format,&local_78);
  if (local_78.super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TestTexture1DArray::TestTexture1DArray (const tcu::CompressedTexFormat& format, int width, int arraySize)
	: TestTexture	(format, width, 1, arraySize)
	, m_texture		(tcu::getUncompressedFormat(format), width, arraySize)
{
	allocateLevels(m_texture);

	std::vector<tcu::PixelBufferAccess> layers;
	for (int levelNdx = 0; levelNdx < m_texture.getNumLevels(); levelNdx++)
		for (int layerNdx = 0; layerNdx < m_texture.getNumLayers(); layerNdx++)
			layers.push_back(getLevel(levelNdx, layerNdx));

	TestTexture::populateCompressedLevels(format, layers);
}